

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts round_canonical(FloatParts p,float_status *s,FloatFmt *parm)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int line;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  bool bVar12;
  FloatParts FVar13;
  
  uVar5 = p._8_8_;
  uVar7 = p.frac;
  uVar8 = p._12_4_ & 0xff;
  if (4 < uVar8 - 1) {
    line = 0x34b;
LAB_00cfdd91:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,line,(char *)0x0);
  }
  uVar10 = parm->exp_max;
  bVar1 = (byte)parm->frac_shift;
  switch(uVar8) {
  case 1:
    uVar7 = 0;
    uVar10 = 0;
    break;
  case 2:
    bVar11 = s->float_rounding_mode;
    if (5 < bVar11) {
      line = 0x2ee;
      goto LAB_00cfdd91;
    }
    uVar4 = parm->frac_lsbm1;
    uVar2 = parm->round_mask;
    switch(bVar11) {
    case 0:
      bVar12 = false;
      uVar3 = 0;
      if ((parm->roundeven_mask & uVar7) != uVar4) {
        uVar3 = uVar4;
      }
      break;
    case 1:
      bVar12 = (uVar5 >> 0x28 & 1) == 0;
      uVar3 = (long)(uVar5 << 0x17) >> 0x3f & uVar2;
      break;
    case 2:
      bVar12 = (bool)(p.sign & 1);
      uVar3 = 0;
      if (((undefined1  [16])p & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
        uVar3 = uVar2;
      }
      break;
    case 3:
      bVar12 = true;
      uVar3 = 0;
      break;
    case 4:
      bVar12 = false;
      uVar3 = uVar4;
      break;
    case 5:
      uVar3 = 0;
      if ((parm->frac_lsb & uVar7) == 0) {
        uVar3 = uVar2;
      }
      bVar12 = true;
    }
    uVar8 = parm->exp_bias + p.exp;
    if (uVar8 == 0 || SCARRY4(parm->exp_bias,p.exp) != (int)uVar8 < 0) {
      if (s->flush_to_zero == '\0') {
        bVar12 = true;
        if ((uVar8 == 0) && (s->float_detect_tininess != '\x01')) {
          bVar12 = -1 < (long)(uVar3 + uVar7);
        }
        if (1 - uVar8 < 0x40) {
          uVar9 = (ulong)(uVar7 << ((char)uVar8 - 1U & 0x3f) != 0) |
                  uVar7 >> ((byte)(1 - uVar8) & 0x3f);
        }
        else {
          uVar9 = (ulong)(uVar7 != 0);
        }
        if ((uVar9 & uVar2) == 0) {
          bVar6 = 0;
          uVar4 = uVar9;
        }
        else {
          if (bVar11 == 5) {
            uVar3 = 0;
            if ((uVar9 & parm->frac_lsb) == 0) {
              uVar3 = uVar2;
            }
          }
          else if ((bVar11 == 0) && (uVar3 = 0, (parm->roundeven_mask & uVar9) != uVar4)) {
            uVar3 = uVar4;
          }
          bVar6 = 0x20;
          uVar4 = uVar3 + uVar9;
        }
        uVar7 = uVar4 >> (bVar1 & 0x3f);
        bVar11 = bVar6 | 0x10;
        if ((uVar9 & uVar2) == 0) {
          bVar11 = bVar6;
        }
        if (!bVar12) {
          bVar11 = bVar6;
        }
        uVar2 = uVar5 & 0xffffff00ffffffff | 0x100000000;
        if (uVar7 != 0) {
          uVar2 = uVar5;
        }
        uVar8 = (uint)(uVar4 >> 0x3e) & 1;
        if (uVar8 == 0) {
          uVar5 = uVar2;
        }
      }
      else {
        bVar11 = 0x80;
        uVar7 = 0;
        uVar8 = 0;
        uVar5 = uVar5 & 0xffffff00ffffffff | 0x100000000;
      }
      goto LAB_00cfdbf7;
    }
    if ((uVar2 & uVar7) == 0) {
      bVar11 = 0;
    }
    else {
      uVar7 = uVar7 + uVar3;
      bVar11 = 0x20;
      if ((long)uVar7 < 0) {
        uVar7 = uVar7 >> 1;
        uVar8 = uVar8 + 1;
      }
    }
    uVar7 = uVar7 >> (bVar1 & 0x3f);
    bVar1 = parm->arm_althp;
    if ((_Bool)bVar1 == true) {
      if ((int)uVar8 <= (int)uVar10) goto LAB_00cfdbf7;
      bVar11 = 1;
    }
    else {
      if ((int)uVar8 < (int)uVar10) goto LAB_00cfdbf7;
      if (bVar12 == false) {
        uVar5 = uVar5 & 0xffffff00ffffffff | 0x300000000;
        bVar11 = 0x28;
        goto LAB_00cfdb09;
      }
      uVar10 = uVar10 - 1;
      bVar11 = 0x28;
    }
    uVar7 = 0xffffffffffffffff;
    uVar8 = uVar10;
    goto LAB_00cfdbf7;
  case 3:
    bVar1 = parm->arm_althp;
    bVar11 = 0;
LAB_00cfdb09:
    if ((bVar1 & 1) != 0) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x33e,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    uVar7 = 0;
    uVar8 = uVar10;
    goto LAB_00cfdbf7;
  default:
    if (parm->arm_althp == true) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x345,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    uVar7 = uVar7 >> (bVar1 & 0x3f);
  }
  bVar11 = 0;
  uVar8 = uVar10;
LAB_00cfdbf7:
  s->float_exception_flags = s->float_exception_flags | bVar11;
  FVar13._8_8_ = uVar5 & 0xffffffff00000000 | (ulong)uVar8;
  FVar13.frac = uVar7;
  return FVar13;
}

Assistant:

static FloatParts round_canonical(FloatParts p, float_status *s,
                                  const FloatFmt *parm)
{
    const uint64_t frac_lsb = parm->frac_lsb;
    const uint64_t frac_lsbm1 = parm->frac_lsbm1;
    const uint64_t round_mask = parm->round_mask;
    const uint64_t roundeven_mask = parm->roundeven_mask;
    const int exp_max = parm->exp_max;
    const int frac_shift = parm->frac_shift;
    uint64_t frac, inc = 0;
    int exp, flags = 0;
    bool overflow_norm = false;

    frac = p.frac;
    exp = p.exp;

    switch (p.cls) {
    case float_class_normal:
        switch (s->float_rounding_mode) {
        case float_round_nearest_even:
            overflow_norm = false;
            inc = ((frac & roundeven_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
            break;
        case float_round_ties_away:
            overflow_norm = false;
            inc = frac_lsbm1;
            break;
        case float_round_to_zero:
            overflow_norm = true;
            inc = 0;
            break;
        case float_round_up:
            inc = p.sign ? 0 : round_mask;
            overflow_norm = p.sign;
            break;
        case float_round_down:
            inc = p.sign ? round_mask : 0;
            overflow_norm = !p.sign;
            break;
        case float_round_to_odd:
            overflow_norm = true;
            inc = frac & frac_lsb ? 0 : round_mask;
            break;
        default:
            g_assert_not_reached();
            break;
        }

        exp += parm->exp_bias;
        if (likely(exp > 0)) {
            if (frac & round_mask) {
                flags |= float_flag_inexact;
                frac += inc;
                if (frac & DECOMPOSED_OVERFLOW_BIT) {
                    frac >>= 1;
                    exp++;
                }
            }
            frac >>= frac_shift;

            if (parm->arm_althp) {
                /* ARM Alt HP eschews Inf and NaN for a wider exponent.  */
                if (unlikely(exp > exp_max)) {
                    /* Overflow.  Return the maximum normal.  */
                    flags = float_flag_invalid;
                    exp = exp_max;
                    frac = -1;
                }
            } else if (unlikely(exp >= exp_max)) {
                flags |= float_flag_overflow | float_flag_inexact;
                if (overflow_norm) {
                    exp = exp_max - 1;
                    frac = -1;
                } else {
                    p.cls = float_class_inf;
                    goto do_inf;
                }
            }
        } else if (s->flush_to_zero) {
            flags |= float_flag_output_denormal;
            p.cls = float_class_zero;
            goto do_zero;
        } else {
            bool is_tiny = (s->float_detect_tininess
                            == float_tininess_before_rounding)
                        || (exp < 0)
                        || !((frac + inc) & DECOMPOSED_OVERFLOW_BIT);

            shift64RightJamming(frac, 1 - exp, &frac);
            if (frac & round_mask) {
                /* Need to recompute round-to-even.  */
                switch (s->float_rounding_mode) {
                case float_round_nearest_even:
                    inc = ((frac & roundeven_mask) != frac_lsbm1
                           ? frac_lsbm1 : 0);
                    break;
                case float_round_to_odd:
                    inc = frac & frac_lsb ? 0 : round_mask;
                    break;
                }
                flags |= float_flag_inexact;
                frac += inc;
            }

            exp = (frac & DECOMPOSED_IMPLICIT_BIT ? 1 : 0);
            frac >>= frac_shift;

            if (is_tiny && (flags & float_flag_inexact)) {
                flags |= float_flag_underflow;
            }
            if (exp == 0 && frac == 0) {
                p.cls = float_class_zero;
            }
        }
        break;

    case float_class_zero:
    do_zero:
        exp = 0;
        frac = 0;
        break;

    case float_class_inf:
    do_inf:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac = 0;
        break;

    case float_class_qnan:
    case float_class_snan:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac >>= parm->frac_shift;
        break;

    default:
        g_assert_not_reached();
        break;
    }

    float_raise(flags, s);
    p.exp = exp;
    p.frac = frac;
    return p;
}